

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O1

void gcm_mult(mbedtls_gcm_context *ctx,uchar *x,uchar *output)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar6;
  undefined1 auVar5 [16];
  uint uVar7;
  undefined1 auVar8 [16];
  
  if (ctx->acceleration != '\0') {
    return;
  }
  uVar3 = (ulong)((x[0xf] & 0xf) << 4);
  uVar2 = *(ulong *)((long)ctx->H[0] + uVar3);
  uVar3 = *(ulong *)((long)ctx->H[0] + uVar3 + 8);
  auVar5._8_8_ = uVar3 >> 4 | uVar2 << 0x3c;
  auVar5._0_8_ = (ulong)last4[(uint)uVar3 & 0xf] << 0x30 ^ uVar2 >> 4;
  auVar5 = *(undefined1 (*) [16])((long)ctx->H[0] + (ulong)(x[0xf] & 0xfffffff0)) ^ auVar5;
  lVar4 = 0xf;
  do {
    puVar1 = (ulong *)((long)ctx->H[0] + (ulong)((x[lVar4 + -1] & 0xf) << 4));
    uVar2 = *puVar1 ^ (ulong)last4[auVar5._8_4_ & 0xf] << 0x30 ^ auVar5._0_8_ >> 4;
    uVar3 = puVar1[1] ^ (auVar5._8_8_ >> 4 | auVar5._0_8_ << 0x3c);
    auVar8._8_8_ = uVar3 >> 4 | uVar2 << 0x3c;
    auVar8._0_8_ = (ulong)last4[(uint)uVar3 & 0xf] << 0x30 ^ uVar2 >> 4;
    auVar5 = *(undefined1 (*) [16])((long)ctx->H[0] + (ulong)(x[lVar4 + -1] & 0xfffffff0)) ^ auVar8;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  uVar2 = auVar5._0_8_;
  *(ulong *)output =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  uVar6 = auVar5._8_4_;
  uVar7 = auVar5._12_4_;
  *(ulong *)(output + 8) =
       (ulong)(uVar7 >> 0x18) | (((ulong)uVar7 & 0xff0000) << 0x20) >> 0x28 |
       (((ulong)uVar7 & 0xff00) << 0x20) >> 0x18 | (((ulong)uVar7 & 0xff) << 0x20) >> 8 |
       ((ulong)uVar6 & 0xff000000) << 8 | ((ulong)uVar6 & 0xff0000) << 0x18 |
       ((ulong)uVar6 & 0xff00) << 0x28 | auVar5._8_8_ << 0x38;
  return;
}

Assistant:

static void gcm_mult(mbedtls_gcm_context *ctx, const unsigned char x[16],
                     unsigned char output[16])
{
    switch (ctx->acceleration) {
#if defined(MBEDTLS_AESNI_HAVE_CODE)
        case MBEDTLS_GCM_ACC_AESNI:
            mbedtls_aesni_gcm_mult(output, x, (uint8_t *) ctx->H[MBEDTLS_GCM_HTABLE_SIZE/2]);
            break;
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
        case MBEDTLS_GCM_ACC_AESCE:
            mbedtls_aesce_gcm_mult(output, x, (uint8_t *) ctx->H[MBEDTLS_GCM_HTABLE_SIZE/2]);
            break;
#endif

#if defined(MBEDTLS_GCM_LARGE_TABLE)
        case MBEDTLS_GCM_ACC_LARGETABLE:
            gcm_mult_largetable(output, x, ctx->H);
            break;
#else
        case MBEDTLS_GCM_ACC_SMALLTABLE:
            gcm_mult_smalltable(output, x, ctx->H);
            break;
#endif
    }

    return;
}